

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

int __thiscall V1Transport::readHeader(V1Transport *this,Span<const_unsigned_char> msg_bytes)

{
  CMessageHeader *this_00;
  bool bVar1;
  uint uVar2;
  string *this_01;
  uint uVar3;
  long in_FS_OFFSET;
  string_view str;
  Span<const_unsigned_char> s;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  string local_68;
  string local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = 0x18 - this->nHdrPos;
  if ((uint)msg_bytes.m_size <= uVar3) {
    uVar3 = (uint)msg_bytes.m_size;
  }
  memcpy((this->hdrbuf).vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
         _M_impl.super__Vector_impl_data._M_start + (ulong)this->nHdrPos + (this->hdrbuf).m_read_pos
         ,msg_bytes.m_data,(ulong)uVar3);
  uVar2 = this->nHdrPos + uVar3;
  this->nHdrPos = uVar2;
  if (uVar2 < 0x18) goto LAB_0070a6c7;
  this_00 = &this->hdr;
  CMessageHeader::SerializationOps<DataStream,CMessageHeader,ActionUnserialize>
            (this_00,&this->hdrbuf);
  bVar1 = std::operator==(&this_00->pchMessageStart,&this->m_magic_bytes);
  if (bVar1) {
    if ((this->hdr).nMessageSize < 0x3d0901) {
      this->in_data = true;
      goto LAB_0070a6c7;
    }
    bVar1 = ::LogAcceptCategory(NET,Debug);
    uVar3 = 0xffffffff;
    if (!bVar1) goto LAB_0070a6c7;
    CMessageHeader::GetCommand_abi_cxx11_(&local_68,this_00);
    str._M_str = local_68._M_dataplus._M_p;
    str._M_len = local_68._M_string_length;
    SanitizeString_abi_cxx11_(&local_48,str,0);
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp";
    source_file._M_len = 0x57;
    logging_function._M_str = "readHeader";
    logging_function._M_len = 10;
    LogPrintFormatInternal<std::__cxx11::string,unsigned_int,long>
              (logging_function,source_file,0x2e1,NET,Debug,(ConstevalFormatString<3U>)0xc986f8,
               &local_48,&(this->hdr).nMessageSize,&this->m_node_id);
    this_01 = &local_68;
    std::__cxx11::string::~string((string *)&local_48);
  }
  else {
    bVar1 = ::LogAcceptCategory(NET,Debug);
    uVar3 = 0xffffffff;
    if (!bVar1) goto LAB_0070a6c7;
    s.m_size = 4;
    s.m_data = (uchar *)this_00;
    HexStr_abi_cxx11_(&local_48,s);
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp";
    source_file_00._M_len = 0x57;
    logging_function_00._M_str = "readHeader";
    logging_function_00._M_len = 10;
    LogPrintFormatInternal<std::__cxx11::string,long>
              (logging_function_00,source_file_00,0x2db,NET,Debug,
               (ConstevalFormatString<2U>)0xc986c1,&local_48,&this->m_node_id);
    this_01 = &local_48;
  }
  uVar3 = 0xffffffff;
  std::__cxx11::string::~string((string *)this_01);
LAB_0070a6c7:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return uVar3;
  }
  __stack_chk_fail();
}

Assistant:

int V1Transport::readHeader(Span<const uint8_t> msg_bytes)
{
    AssertLockHeld(m_recv_mutex);
    // copy data to temporary parsing buffer
    unsigned int nRemaining = CMessageHeader::HEADER_SIZE - nHdrPos;
    unsigned int nCopy = std::min<unsigned int>(nRemaining, msg_bytes.size());

    memcpy(&hdrbuf[nHdrPos], msg_bytes.data(), nCopy);
    nHdrPos += nCopy;

    // if header incomplete, exit
    if (nHdrPos < CMessageHeader::HEADER_SIZE)
        return nCopy;

    // deserialize to CMessageHeader
    try {
        hdrbuf >> hdr;
    }
    catch (const std::exception&) {
        LogDebug(BCLog::NET, "Header error: Unable to deserialize, peer=%d\n", m_node_id);
        return -1;
    }

    // Check start string, network magic
    if (hdr.pchMessageStart != m_magic_bytes) {
        LogDebug(BCLog::NET, "Header error: Wrong MessageStart %s received, peer=%d\n", HexStr(hdr.pchMessageStart), m_node_id);
        return -1;
    }

    // reject messages larger than MAX_SIZE or MAX_PROTOCOL_MESSAGE_LENGTH
    if (hdr.nMessageSize > MAX_SIZE || hdr.nMessageSize > MAX_PROTOCOL_MESSAGE_LENGTH) {
        LogDebug(BCLog::NET, "Header error: Size too large (%s, %u bytes), peer=%d\n", SanitizeString(hdr.GetCommand()), hdr.nMessageSize, m_node_id);
        return -1;
    }

    // switch state to reading message data
    in_data = true;

    return nCopy;
}